

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorBase.cpp
# Opt level: O3

void __thiscall
pele::physics::reactions::ReactorBase::set_sundials_solver_tols
          (ReactorBase *this,Context *sunctx,void *sundials_mem,int ncells,Real relTol,Real absTol,
          string *solvername)

{
  ostringstream *poVar1;
  int iVar2;
  N_Vector v;
  realtype *prVar3;
  ulong uVar4;
  long lVar5;
  int flag;
  Print local_1b8;
  
  v = N_VNew_Serial(ncells * 10,
                    *(sunctx->sunctx_)._M_t.
                     super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>._M_t.
                     super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>.
                     super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
  prVar3 = N_VGetArrayPointer(v);
  if ((this->m_typ_vals)._M_elems[0] <= 0.0) {
    if (0 < this->verbose) {
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
      poVar1 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Setting ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(solvername->_M_dataplus)._M_p,solvername->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," tolerances rtol = ",0x13);
      std::ostream::_M_insert<double>(relTol);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," atol = ",8);
      std::ostream::_M_insert<double>(absTol);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," in PelePhysics \n",0x11);
      amrex::Print::~Print(&local_1b8);
    }
    if (0 < ncells) {
      uVar4 = 0;
      do {
        prVar3[uVar4] = absTol;
        (prVar3 + uVar4)[1] = absTol;
        uVar4 = uVar4 + 2;
      } while ((uint)(ncells * 10) != uVar4);
    }
  }
  else {
    if (0 < this->verbose) {
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
      poVar1 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Setting ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(solvername->_M_dataplus)._M_p,solvername->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," tolerances with TypVals rtol = ",0x20);
      std::ostream::_M_insert<double>(relTol);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," atolfact = ",0xc);
      std::ostream::_M_insert<double>(absTol);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," in PelePhysics \n",0x11);
      amrex::Print::~Print(&local_1b8);
    }
    if (0 < ncells) {
      uVar4 = 0;
      do {
        lVar5 = 0;
        do {
          prVar3[lVar5] = (this->m_typ_vals)._M_elems[lVar5] * absTol;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 10);
        uVar4 = uVar4 + 1;
        prVar3 = prVar3 + 10;
      } while (uVar4 != (uint)ncells);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)solvername);
  if (iVar2 == 0) {
    local_1b8.rank = CVodeSVtolerances(sundials_mem,relTol,v);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)solvername);
    if (iVar2 == 0) {
      local_1b8.rank = ARKStepSVtolerances(sundials_mem,relTol,v);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)solvername);
      if (iVar2 == 0) {
        local_1b8.rank = ERKStepSVtolerances(sundials_mem,relTol,v);
      }
      else {
        amrex::Abort_host("setSundialsSolverTols not implemented for this solver type");
      }
    }
  }
  iVar2 = utils::check_flag(&local_1b8,"SVtolerances",1);
  if (iVar2 != 0) {
    amrex::Abort_host("Problem in setSundialsSolverTols");
  }
  N_VDestroy(v);
  return;
}

Assistant:

void
ReactorBase::set_sundials_solver_tols(
  // cppcheck-suppress constParameter
  sundials::Context& sunctx,
  void* sundials_mem,
  const int ncells,
  const amrex::Real relTol,
  const amrex::Real absTol,
  const std::string& solvername)
{
  int omp_thread = 0;
#ifdef AMREX_USE_OMP
  omp_thread = omp_get_thread_num();
#endif

  const int neq_tot = (NUM_SPECIES + 1) * ncells;

#if defined(AMREX_USE_CUDA)
  N_Vector atol = N_VNewWithMemHelp_Cuda(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_Vector atol = N_VNewWithMemHelp_Hip(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_Vector atol = N_VNewWithMemHelp_Sycl(
    neq_tot, /*use_managed_mem=*/false,
    *amrex::sundials::The_SUNMemory_Helper(),
    &amrex::Gpu::Device::streamQueue(), sunctx);
  amrex::Real* ratol = N_VGetHostArrayPointer_Sycl(atol);
#else
  N_Vector atol = N_VNew_Serial(neq_tot, sunctx);
  amrex::Real* ratol = N_VGetArrayPointer(atol);
#endif

  if (m_typ_vals[0] > 0.0) {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances with TypVals rtol = " << relTol
                     << " atolfact = " << absTol << " in PelePhysics \n";
    }
    for (int i = 0; i < ncells; i++) {
      const int offset = i * (NUM_SPECIES + 1);
      for (int k = 0; k < NUM_SPECIES + 1; k++) {
        ratol[offset + k] = m_typ_vals[k] * absTol;
      }
    }
  } else {
    // cppcheck-suppress knownConditionTrueFalse
    if ((verbose > 0) && (omp_thread == 0)) {
      amrex::Print() << " Setting " << solvername
                     << " tolerances rtol = " << relTol << " atol = " << absTol
                     << " in PelePhysics \n";
    }
    for (int i = 0; i < neq_tot; i++) {
      ratol[i] = absTol;
    }
  }

#if defined(AMREX_USE_CUDA)
  N_VCopyToDevice_Cuda(atol);
#elif defined(AMREX_USE_HIP)
  N_VCopyToDevice_Hip(atol);
#elif defined(AMREX_USE_DPCPP)
  N_VCopyToDevice_Sycl(atol);
#endif

  // Call CVodeSVtolerances to specify the scalar relative tolerance
  // and vector absolute tolerances
  int flag;
  if (solvername == "cvode") {
    flag = CVodeSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "arkstep") {
    flag = ARKStepSVtolerances(sundials_mem, relTol, atol);
  } else if (solvername == "erkstep") {
    flag = ERKStepSVtolerances(sundials_mem, relTol, atol);
  } else {
    amrex::Abort("setSundialsSolverTols not implemented for this solver type");
  }
  if (utils::check_flag(&flag, "SVtolerances", 1) != 0) {
    amrex::Abort("Problem in setSundialsSolverTols");
  }

  N_VDestroy(atol);
}